

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoke_test.cxx
# Opt level: O0

void local_sum(Block *b,ProxyWithLink *cp)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  Proxy *this;
  Proxy *pPVar3;
  reference pvVar4;
  BlockID *to;
  ostream *poVar5;
  void *this_00;
  char *in_RDX;
  ProxyWithLink *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i_1;
  uint i;
  int total;
  Link *l;
  ProxyWithLink *save;
  undefined4 in_stack_ffffffffffffffc0;
  int local_24;
  uint local_20;
  int local_1c;
  undefined8 local_18;
  ProxyWithLink *local_10;
  vector<int,_std::allocator<int>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = diy::Master::ProxyWithLink::link(in_RSI,(char *)in_RSI,in_RDX);
  local_18 = CONCAT44(extraout_var,iVar1);
  local_1c = 0;
  local_20 = 0;
  while( true ) {
    this = (Proxy *)(ulong)local_20;
    pPVar3 = (Proxy *)std::vector<int,_std::allocator<int>_>::size(local_8);
    if (pPVar3 <= this) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_8,(ulong)local_20);
    local_1c = *pvVar4 + local_1c;
    local_20 = local_20 + 1;
  }
  to = (BlockID *)std::operator<<((ostream *)&std::cout,"Total     (");
  iVar1 = diy::Master::Proxy::gid(&local_10->super_Proxy);
  poVar5 = (ostream *)std::ostream::operator<<(to,iVar1);
  poVar5 = std::operator<<(poVar5,"): ");
  this_00 = (void *)std::ostream::operator<<(poVar5,local_1c);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_24 = 0;
  while( true ) {
    iVar1 = local_24;
    iVar2 = diy::Link::size((Link *)0x110146);
    if (iVar2 <= iVar1) break;
    save = local_10;
    diy::Link::target((Link *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                      (int)((ulong)local_10 >> 0x20));
    diy::Master::Proxy::enqueue<int>
              (this,to,(int *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
               (_func_void_BinaryBuffer_ptr_int_ptr *)save);
    local_24 = local_24 + 1;
  }
  diy::Master::Proxy::all_reduce<int,std::plus<int>>(&local_10->super_Proxy,&local_1c);
  return;
}

Assistant:

void local_sum(Block* b,                             // local block
               const diy::Master::ProxyWithLink& cp) // communication proxy
{
    diy::Link*    l = cp.link();

    // compute local sum
    int total = 0;
    for (unsigned i = 0; i < b->values.size(); ++i)
        total += b->values[i];

    std::cout << "Total     (" << cp.gid() << "): " << total        << std::endl;

    // for all neighbor blocks
    // enqueue data to be sent to this neighbor block in the next exchange
    for (int i = 0; i < l->size(); ++i)
        cp.enqueue(l->target(i), total);

    // diy collectives (optional) are piggybacking on the enqueue/exchange/dequeue mechanism.
    // They are invoked by posting the collective at the time of the enqueue and getting the
    // result at the time of the dequeue.
    // all_reduce() is the posting of the collective.
    cp.all_reduce(total, std::plus<int>());
}